

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

StringRef __thiscall
llvm::yaml::
ScalarTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::input(ScalarTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
        *this,StringRef Scalar,void *param_2,string *Val)

{
  StringRef SVar1;
  string local_58;
  string *local_38;
  string *Val_local;
  void *param_1_local;
  StringRef Scalar_local;
  
  Val_local = (string *)Scalar.Length;
  Scalar_local.Data = Scalar.Data;
  local_38 = (string *)param_2;
  param_1_local = this;
  StringRef::str_abi_cxx11_(&local_58,(StringRef *)&param_1_local);
  std::__cxx11::string::operator=(local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  Scalar_local.Length = 0;
  StringRef::StringRef((StringRef *)&Scalar_local.Length);
  SVar1.Length = 0;
  SVar1.Data = (char *)Scalar_local.Length;
  return SVar1;
}

Assistant:

StringRef ScalarTraits<std::string>::input(StringRef Scalar, void *,
                                         std::string &Val) {
  Val = Scalar.str();
  return StringRef();
}